

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O0

void signalHandler(int signum)

{
  long lVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_05;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_06;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_07;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_08;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_09;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_10;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_11;
  float fVar2;
  bool bVar3;
  byte bVar4;
  ostream *poVar5;
  ArgPositional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pAVar6;
  ArgFlag *pAVar7;
  ArgOption<float> *pAVar8;
  ArgOption<unsigned_int> *pAVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  uint *puVar11;
  float *pfVar12;
  char *pcVar13;
  int iVar14;
  rep_conflict1 rVar15;
  rep_conflict rVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_14e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_1490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_1440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_13f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_13b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_1370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_1328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_12e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_1298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_1250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_1208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_11b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_1158;
  string sStack_10e8;
  int iStack_10c4;
  duration<long,_std::ratio<1L,_1000000000L>_> dStack_10c0;
  duration<double,_std::ratio<1L,_1L>_> dStack_10b8;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tStack_10b0;
  byte bStack_10a1;
  int iStack_1094;
  duration<long,_std::ratio<1L,_1000000000L>_> dStack_1090;
  duration<float,_std::ratio<1L,_1L>_> dStack_1084;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tStack_1080;
  byte bStack_1071;
  rep rStack_1070;
  float fStack_1068;
  float fStack_1064;
  long alStack_1060 [35];
  undefined1 auStack_f48 [524];
  undefined4 uStack_d3c;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  aStack_d2c;
  undefined1 uStack_d2b;
  allocator aStack_d2a;
  allocator aStack_d29;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_d28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_d20;
  string asStack_d00 [32];
  iterator pbStack_ce0;
  size_type sStack_cd8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_cd0;
  string sStack_cb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_c98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_c78;
  allocator aStack_c51;
  string sStack_c50;
  ArgOption<float> *pAStack_c30;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  aStack_c24;
  undefined1 uStack_c23;
  allocator aStack_c22;
  allocator aStack_c21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_c20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_c18;
  string asStack_bf8 [32];
  iterator pbStack_bd8;
  size_type sStack_bd0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_bc8;
  string sStack_bb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_b90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_b70;
  allocator aStack_b49;
  string sStack_b48;
  ArgOption<float> *pAStack_b28;
  float fStack_b1c;
  float fStack_b18;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  aStack_b14;
  undefined1 uStack_b13;
  allocator aStack_b12;
  allocator aStack_b11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_b10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_b08;
  string asStack_ae8 [32];
  iterator pbStack_ac8;
  size_type sStack_ac0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_ab8;
  string sStack_aa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_a80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_a60;
  allocator aStack_a39;
  string sStack_a38;
  ArgOption<unsigned_int> *pAStack_a18;
  uint uStack_a10;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  aStack_a0b;
  undefined1 uStack_a0a;
  allocator aStack_a09;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_a08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_a00;
  iterator pbStack_9e0;
  size_type sStack_9d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_9d0;
  string sStack_9b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_998;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_978;
  allocator aStack_951;
  string sStack_950;
  ArgOption<float> *pAStack_930;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  aStack_923;
  undefined1 uStack_922;
  allocator aStack_921;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_920;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_918;
  iterator pbStack_8f8;
  size_type sStack_8f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_8e8;
  string sStack_8d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_8b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_890;
  allocator aStack_869;
  string sStack_868;
  ArgOption<float> *pAStack_848;
  float fStack_83c;
  float fStack_838;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  aStack_833;
  undefined1 uStack_832;
  allocator aStack_831;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_830;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_828;
  iterator pbStack_808;
  size_type sStack_800;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_7f8;
  allocator aStack_7d9;
  string sStack_7d8;
  allocator aStack_7b1;
  string sStack_7b0;
  ArgFlag *pAStack_790;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  aStack_783;
  undefined1 uStack_782;
  allocator aStack_781;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_780;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_778;
  iterator pbStack_758;
  size_type sStack_750;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_748;
  allocator aStack_729;
  string sStack_728;
  allocator aStack_701;
  string sStack_700;
  ArgFlag *pAStack_6e0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  aStack_6d3;
  undefined1 uStack_6d2;
  allocator aStack_6d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_6d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_6c8;
  iterator pbStack_6a8;
  size_type sStack_6a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_698;
  allocator aStack_679;
  string sStack_678;
  allocator aStack_651;
  string sStack_650;
  ArgFlag *pAStack_630;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  aStack_623;
  undefined1 uStack_622;
  allocator aStack_621;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_620;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_618;
  iterator pbStack_5f8;
  size_type sStack_5f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_5e8;
  allocator aStack_5c9;
  string sStack_5c8;
  allocator aStack_5a1;
  string sStack_5a0;
  ArgFlag *pAStack_580;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  aStack_573;
  undefined1 uStack_572;
  allocator aStack_571;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_570;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_568;
  iterator pbStack_548;
  size_type sStack_540;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_538;
  allocator aStack_519;
  string sStack_518;
  allocator aStack_4f1;
  string sStack_4f0;
  ArgFlag *pAStack_4d0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  aStack_4c4;
  undefined1 uStack_4c3;
  allocator aStack_4c2;
  allocator aStack_4c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_4c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_4b8;
  string asStack_498 [32];
  iterator pbStack_478;
  size_type sStack_470;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_468;
  allocator aStack_449;
  string sStack_448;
  allocator aStack_421;
  string sStack_420;
  ArgFlag *pAStack_400;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  aStack_3f4;
  undefined1 uStack_3f3;
  allocator aStack_3f2;
  allocator aStack_3f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_3e8;
  string asStack_3c8 [32];
  iterator pbStack_3a8;
  size_type sStack_3a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_398;
  allocator aStack_379;
  string sStack_378;
  allocator aStack_351;
  string sStack_350;
  ArgFlag *pAStack_330;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  aStack_324;
  undefined1 uStack_323;
  allocator aStack_322;
  allocator aStack_321;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_318;
  string asStack_2f8 [32];
  iterator pbStack_2d8;
  size_type sStack_2d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_2c8;
  allocator aStack_2a9;
  string sStack_2a8;
  allocator aStack_281;
  string sStack_280;
  ArgFlag *pAStack_260;
  allocator aStack_251;
  string sStack_250;
  allocator aStack_229;
  string sStack_228;
  ArgPositional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pAStack_208;
  allocator aStack_1e9;
  string sStack_1e8;
  ArgumentParser AStack_1c8;
  char **ppcStack_60;
  int iStack_58;
  undefined4 uStack_54;
  undefined1 *puStack_50;
  ostream *local_40;
  ostream *local_38;
  int local_2c;
  duration<long,_std::ratio<1L,_1000000000L>_> local_28;
  duration<double,_std::ratio<1L,_1L>_> local_20;
  duration<double,_std::ratio<1L,_1L>_> elapsed;
  time_point end_time;
  undefined1 auStack_8 [4];
  int signum_local;
  
  puStack_50 = (undefined1 *)0x12a9ee;
  poVar5 = std::operator<<((ostream *)&std::cout,"Interrupt signal (");
  puStack_50 = (undefined1 *)0x12a9f9;
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,signum);
  puStack_50 = (undefined1 *)0x12aa08;
  std::operator<<(poVar5,") received.\n");
  puStack_50 = (undefined1 *)0x12aa0d;
  elapsed.__r = (rep_conflict)std::chrono::_V2::steady_clock::now();
  puStack_50 = (undefined1 *)0x12aa21;
  local_28.__r = (rep)std::chrono::operator-
                                ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                  *)&elapsed,&start);
  puStack_50 = (undefined1 *)0x12aa32;
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            ((duration<double,std::ratio<1l,1l>> *)&local_20,&local_28);
  puStack_50 = (undefined1 *)0x12aa45;
  poVar5 = std::operator<<((ostream *)&std::cout,"stopped after: ");
  puStack_50 = (undefined1 *)0x12aa54;
  local_40 = (ostream *)std::ostream::operator<<(poVar5,std::fixed);
  puStack_50 = (undefined1 *)0x12aa62;
  local_2c = (int)std::setprecision(2);
  puStack_50 = (undefined1 *)0x12aa71;
  local_38 = std::operator<<(local_40,(_Setprecision)local_2c);
  puStack_50 = (undefined1 *)0x12aa7e;
  rVar16 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_20);
  puStack_50 = (undefined1 *)0x12aa87;
  poVar5 = (ostream *)std::ostream::operator<<(local_38,rVar16);
  puStack_50 = (undefined1 *)0x12aa96;
  std::operator<<(poVar5,"s\n");
  pcVar13 = "UNKNOWN\n";
  puStack_50 = (undefined1 *)0x12aaa9;
  std::operator<<((ostream *)&std::cout,"UNKNOWN\n");
  iVar14 = 1;
  puStack_50 = (undefined1 *)0x12aab3;
  _Exit(1);
  uStack_54 = 0;
  ppcStack_60 = (char **)pcVar13;
  iStack_58 = iVar14;
  puStack_50 = auStack_8;
  signal(2,signalHandler);
  signal(0xf,signalHandler);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&sStack_1e8,"SAT solver for propositional logic",&aStack_1e9);
  Utils::ArgumentParser::ArgumentParser(&AStack_1c8,&sStack_1e8,&program_description_abi_cxx11_);
  std::__cxx11::string::~string((string *)&sStack_1e8);
  std::allocator<char>::~allocator((allocator<char> *)&aStack_1e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&sStack_228,"input",&aStack_229);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&sStack_250,"input file (in DIMACS format). If not specified, use stdin",
             &aStack_251);
  pAVar6 = Utils::ArgumentParser::make_positional<std::__cxx11::string>
                     (&AStack_1c8,&sStack_228,&sStack_250);
  std::__cxx11::string::~string((string *)&sStack_250);
  std::allocator<char>::~allocator((allocator<char> *)&aStack_251);
  std::__cxx11::string::~string((string *)&sStack_228);
  std::allocator<char>::~allocator((allocator<char> *)&aStack_229);
  pAStack_208 = pAVar6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&sStack_280,"help",&aStack_281);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&sStack_2a8,"print this message and exit",&aStack_2a9);
  uStack_323 = 1;
  pbStack_320 = &bStack_318;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&bStack_318,"h",&aStack_321);
  pbStack_320 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)asStack_2f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_2f8,"help",&aStack_322);
  uStack_323 = 0;
  pbStack_2d8 = &bStack_318;
  sStack_2d0 = 2;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&aStack_324);
  __l_11._M_len = sStack_2d0;
  __l_11._M_array = pbStack_2d8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&vStack_2c8,__l_11,&aStack_324);
  pAVar7 = Utils::ArgumentParser::make_flag(&AStack_1c8,&sStack_280,&sStack_2a8,&vStack_2c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_2c8);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&aStack_324);
  pbStack_1158 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pbStack_2d8;
  do {
    pbStack_1158 = pbStack_1158 + -1;
    std::__cxx11::string::~string((string *)pbStack_1158);
  } while (pbStack_1158 != &bStack_318);
  std::allocator<char>::~allocator((allocator<char> *)&aStack_322);
  std::allocator<char>::~allocator((allocator<char> *)&aStack_321);
  std::__cxx11::string::~string((string *)&sStack_2a8);
  std::allocator<char>::~allocator((allocator<char> *)&aStack_2a9);
  std::__cxx11::string::~string((string *)&sStack_280);
  std::allocator<char>::~allocator((allocator<char> *)&aStack_281);
  pAStack_260 = pAVar7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&sStack_350,"verbose",&aStack_351);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&sStack_378,
             "print the resolution process step by step.\nWARNING: can be really expansive",
             &aStack_379);
  uStack_3f3 = 1;
  pbStack_3f0 = &bStack_3e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&bStack_3e8,"v",&aStack_3f1);
  pbStack_3f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)asStack_3c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_3c8,"verbose",&aStack_3f2);
  uStack_3f3 = 0;
  pbStack_3a8 = &bStack_3e8;
  sStack_3a0 = 2;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&aStack_3f4);
  __l_10._M_len = sStack_3a0;
  __l_10._M_array = pbStack_3a8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&vStack_398,__l_10,&aStack_3f4);
  pAVar7 = Utils::ArgumentParser::make_flag(&AStack_1c8,&sStack_350,&sStack_378,&vStack_398);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_398);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&aStack_3f4);
  pbStack_11b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pbStack_3a8;
  do {
    pbStack_11b0 = pbStack_11b0 + -1;
    std::__cxx11::string::~string((string *)pbStack_11b0);
  } while (pbStack_11b0 != &bStack_3e8);
  std::allocator<char>::~allocator((allocator<char> *)&aStack_3f2);
  std::allocator<char>::~allocator((allocator<char> *)&aStack_3f1);
  std::__cxx11::string::~string((string *)&sStack_378);
  std::allocator<char>::~allocator((allocator<char> *)&aStack_379);
  std::__cxx11::string::~string((string *)&sStack_350);
  std::allocator<char>::~allocator((allocator<char> *)&aStack_351);
  pAStack_330 = pAVar7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&sStack_420,"print_proof",&aStack_421);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&sStack_448,"print proof (both for sat and unsat)",&aStack_449);
  uStack_4c3 = 1;
  pbStack_4c0 = &bStack_4b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&bStack_4b8,"p",&aStack_4c1);
  pbStack_4c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)asStack_498;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_498,"proof",&aStack_4c2);
  uStack_4c3 = 0;
  pbStack_478 = &bStack_4b8;
  sStack_470 = 2;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&aStack_4c4);
  __l_09._M_len = sStack_470;
  __l_09._M_array = pbStack_478;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&vStack_468,__l_09,&aStack_4c4);
  pAVar7 = Utils::ArgumentParser::make_flag(&AStack_1c8,&sStack_420,&sStack_448,&vStack_468);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_468);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&aStack_4c4);
  pbStack_1208 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pbStack_478;
  do {
    pbStack_1208 = pbStack_1208 + -1;
    std::__cxx11::string::~string((string *)pbStack_1208);
  } while (pbStack_1208 != &bStack_4b8);
  std::allocator<char>::~allocator((allocator<char> *)&aStack_4c2);
  std::allocator<char>::~allocator((allocator<char> *)&aStack_4c1);
  std::__cxx11::string::~string((string *)&sStack_448);
  std::allocator<char>::~allocator((allocator<char> *)&aStack_449);
  std::__cxx11::string::~string((string *)&sStack_420);
  std::allocator<char>::~allocator((allocator<char> *)&aStack_421);
  pAStack_400 = pAVar7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&sStack_4f0,"no_preprocessing",&aStack_4f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&sStack_518,"disable preprocessing of clause",&aStack_519);
  uStack_572 = 1;
  pbStack_570 = &bStack_568;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&bStack_568,"no-preprocessing",&aStack_571);
  uStack_572 = 0;
  pbStack_548 = &bStack_568;
  sStack_540 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&aStack_573);
  __l_08._M_len = sStack_540;
  __l_08._M_array = pbStack_548;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&vStack_538,__l_08,&aStack_573);
  pAVar7 = Utils::ArgumentParser::make_flag(&AStack_1c8,&sStack_4f0,&sStack_518,&vStack_538);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_538);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&aStack_573);
  pbStack_1250 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pbStack_548;
  do {
    pbStack_1250 = pbStack_1250 + -1;
    std::__cxx11::string::~string((string *)pbStack_1250);
  } while (pbStack_1250 != &bStack_568);
  std::allocator<char>::~allocator((allocator<char> *)&aStack_571);
  std::__cxx11::string::~string((string *)&sStack_518);
  std::allocator<char>::~allocator((allocator<char> *)&aStack_519);
  std::__cxx11::string::~string((string *)&sStack_4f0);
  std::allocator<char>::~allocator((allocator<char> *)&aStack_4f1);
  pAStack_4d0 = pAVar7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&sStack_5a0,"no_restart",&aStack_5a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&sStack_5c8,"disable search restart",&aStack_5c9);
  uStack_622 = 1;
  pbStack_620 = &bStack_618;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&bStack_618,"no-restart",&aStack_621);
  uStack_622 = 0;
  pbStack_5f8 = &bStack_618;
  sStack_5f0 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&aStack_623);
  __l_07._M_len = sStack_5f0;
  __l_07._M_array = pbStack_5f8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&vStack_5e8,__l_07,&aStack_623);
  pAVar7 = Utils::ArgumentParser::make_flag(&AStack_1c8,&sStack_5a0,&sStack_5c8,&vStack_5e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_5e8);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&aStack_623);
  pbStack_1298 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pbStack_5f8;
  do {
    pbStack_1298 = pbStack_1298 + -1;
    std::__cxx11::string::~string((string *)pbStack_1298);
  } while (pbStack_1298 != &bStack_618);
  std::allocator<char>::~allocator((allocator<char> *)&aStack_621);
  std::__cxx11::string::~string((string *)&sStack_5c8);
  std::allocator<char>::~allocator((allocator<char> *)&aStack_5c9);
  std::__cxx11::string::~string((string *)&sStack_5a0);
  std::allocator<char>::~allocator((allocator<char> *)&aStack_5a1);
  pAStack_580 = pAVar7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&sStack_650,"no_deletion",&aStack_651);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&sStack_678,"disable deletion of learned clauses",&aStack_679);
  uStack_6d2 = 1;
  pbStack_6d0 = &bStack_6c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&bStack_6c8,"no-deletion",&aStack_6d1);
  uStack_6d2 = 0;
  pbStack_6a8 = &bStack_6c8;
  sStack_6a0 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&aStack_6d3);
  __l_06._M_len = sStack_6a0;
  __l_06._M_array = pbStack_6a8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&vStack_698,__l_06,&aStack_6d3);
  pAVar7 = Utils::ArgumentParser::make_flag(&AStack_1c8,&sStack_650,&sStack_678,&vStack_698);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_698);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&aStack_6d3);
  pbStack_12e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pbStack_6a8;
  do {
    pbStack_12e0 = pbStack_12e0 + -1;
    std::__cxx11::string::~string((string *)pbStack_12e0);
  } while (pbStack_12e0 != &bStack_6c8);
  std::allocator<char>::~allocator((allocator<char> *)&aStack_6d1);
  std::__cxx11::string::~string((string *)&sStack_678);
  std::allocator<char>::~allocator((allocator<char> *)&aStack_679);
  std::__cxx11::string::~string((string *)&sStack_650);
  std::allocator<char>::~allocator((allocator<char> *)&aStack_651);
  pAStack_630 = pAVar7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&sStack_700,"no_random_choice",&aStack_701);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&sStack_728,"disable random selection of literal in 1% of the cases",
             &aStack_729);
  uStack_782 = 1;
  pbStack_780 = &bStack_778;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&bStack_778,"no-random",&aStack_781);
  uStack_782 = 0;
  pbStack_758 = &bStack_778;
  sStack_750 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&aStack_783);
  __l_05._M_len = sStack_750;
  __l_05._M_array = pbStack_758;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&vStack_748,__l_05,&aStack_783);
  pAVar7 = Utils::ArgumentParser::make_flag(&AStack_1c8,&sStack_700,&sStack_728,&vStack_748);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_748);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&aStack_783);
  pbStack_1328 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pbStack_758;
  do {
    pbStack_1328 = pbStack_1328 + -1;
    std::__cxx11::string::~string((string *)pbStack_1328);
  } while (pbStack_1328 != &bStack_778);
  std::allocator<char>::~allocator((allocator<char> *)&aStack_781);
  std::__cxx11::string::~string((string *)&sStack_728);
  std::allocator<char>::~allocator((allocator<char> *)&aStack_729);
  std::__cxx11::string::~string((string *)&sStack_700);
  std::allocator<char>::~allocator((allocator<char> *)&aStack_701);
  pAStack_6e0 = pAVar7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&sStack_7b0,"no_cc_reduction",&aStack_7b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&sStack_7d8,"disable reduction of the conflict clause",&aStack_7d9);
  uStack_832 = 1;
  pbStack_830 = &bStack_828;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&bStack_828,"no-cc-reduction",&aStack_831);
  uStack_832 = 0;
  pbStack_808 = &bStack_828;
  sStack_800 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&aStack_833);
  __l_04._M_len = sStack_800;
  __l_04._M_array = pbStack_808;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&vStack_7f8,__l_04,&aStack_833);
  pAVar7 = Utils::ArgumentParser::make_flag(&AStack_1c8,&sStack_7b0,&sStack_7d8,&vStack_7f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_7f8);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&aStack_833);
  pbStack_1370 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pbStack_808;
  do {
    pbStack_1370 = pbStack_1370 + -1;
    std::__cxx11::string::~string((string *)pbStack_1370);
  } while (pbStack_1370 != &bStack_828);
  std::allocator<char>::~allocator((allocator<char> *)&aStack_831);
  std::__cxx11::string::~string((string *)&sStack_7d8);
  std::allocator<char>::~allocator((allocator<char> *)&aStack_7d9);
  std::__cxx11::string::~string((string *)&sStack_7b0);
  std::allocator<char>::~allocator((allocator<char> *)&aStack_7b1);
  fStack_838 = 0.95;
  fStack_83c = 0.999;
  pAStack_790 = pAVar7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&sStack_868,"clause decay",&aStack_869);
  std::__cxx11::to_string(&sStack_8d0,fStack_83c);
  std::operator+(&bStack_8b0,anon_var_dwarf_c2a4,&sStack_8d0);
  std::operator+(&bStack_890,&bStack_8b0,")");
  uStack_922 = 1;
  pbStack_920 = &bStack_918;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&bStack_918,"c-decay",&aStack_921);
  uStack_922 = 0;
  pbStack_8f8 = &bStack_918;
  sStack_8f0 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&aStack_923);
  __l_03._M_len = sStack_8f0;
  __l_03._M_array = pbStack_8f8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&vStack_8e8,__l_03,&aStack_923);
  pAVar8 = Utils::ArgumentParser::make_option<float>
                     (&AStack_1c8,&sStack_868,&bStack_890,&vStack_8e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_8e8);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&aStack_923);
  pbStack_13b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pbStack_8f8;
  do {
    pbStack_13b0 = pbStack_13b0 + -1;
    std::__cxx11::string::~string((string *)pbStack_13b0);
  } while (pbStack_13b0 != &bStack_918);
  std::allocator<char>::~allocator((allocator<char> *)&aStack_921);
  std::__cxx11::string::~string((string *)&bStack_890);
  std::__cxx11::string::~string((string *)&bStack_8b0);
  std::__cxx11::string::~string((string *)&sStack_8d0);
  std::__cxx11::string::~string((string *)&sStack_868);
  std::allocator<char>::~allocator((allocator<char> *)&aStack_869);
  pAStack_848 = pAVar8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&sStack_950,"literal decay",&aStack_951);
  std::__cxx11::to_string(&sStack_9b8,fStack_838);
  std::operator+(&bStack_998,anon_var_dwarf_c2ec,&sStack_9b8);
  std::operator+(&bStack_978,&bStack_998,")");
  uStack_a0a = 1;
  pbStack_a08 = &bStack_a00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&bStack_a00,"l-decay",&aStack_a09);
  uStack_a0a = 0;
  pbStack_9e0 = &bStack_a00;
  sStack_9d8 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&aStack_a0b);
  __l_02._M_len = sStack_9d8;
  __l_02._M_array = pbStack_9e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&vStack_9d0,__l_02,&aStack_a0b);
  pAVar8 = Utils::ArgumentParser::make_option<float>
                     (&AStack_1c8,&sStack_950,&bStack_978,&vStack_9d0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_9d0);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&aStack_a0b);
  pbStack_13f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pbStack_9e0;
  do {
    pbStack_13f0 = pbStack_13f0 + -1;
    std::__cxx11::string::~string((string *)pbStack_13f0);
  } while (pbStack_13f0 != &bStack_a00);
  std::allocator<char>::~allocator((allocator<char> *)&aStack_a09);
  std::__cxx11::string::~string((string *)&bStack_978);
  std::__cxx11::string::~string((string *)&bStack_998);
  std::__cxx11::string::~string((string *)&sStack_9b8);
  std::__cxx11::string::~string((string *)&sStack_950);
  std::allocator<char>::~allocator((allocator<char> *)&aStack_951);
  uStack_a10 = 100;
  pAStack_930 = pAVar8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&sStack_a38,"restart multiplier",&aStack_a39);
  std::__cxx11::to_string(&sStack_aa0,uStack_a10);
  std::operator+(&bStack_a80,"restarting sequence multiplicator (default ",&sStack_aa0);
  std::operator+(&bStack_a60,&bStack_a80,")");
  uStack_b13 = 1;
  pbStack_b10 = &bStack_b08;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&bStack_b08,"b",&aStack_b11);
  pbStack_b10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)asStack_ae8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_ae8,"restart-mult",&aStack_b12);
  uStack_b13 = 0;
  pbStack_ac8 = &bStack_b08;
  sStack_ac0 = 2;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&aStack_b14);
  __l_01._M_len = sStack_ac0;
  __l_01._M_array = pbStack_ac8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&vStack_ab8,__l_01,&aStack_b14);
  pAVar9 = Utils::ArgumentParser::make_option<unsigned_int>
                     (&AStack_1c8,&sStack_a38,&bStack_a60,&vStack_ab8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_ab8);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&aStack_b14);
  pbStack_1440 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pbStack_ac8;
  do {
    pbStack_1440 = pbStack_1440 + -1;
    std::__cxx11::string::~string((string *)pbStack_1440);
  } while (pbStack_1440 != &bStack_b08);
  std::allocator<char>::~allocator((allocator<char> *)&aStack_b12);
  std::allocator<char>::~allocator((allocator<char> *)&aStack_b11);
  std::__cxx11::string::~string((string *)&bStack_a60);
  std::__cxx11::string::~string((string *)&bStack_a80);
  std::__cxx11::string::~string((string *)&sStack_aa0);
  std::__cxx11::string::~string((string *)&sStack_a38);
  std::allocator<char>::~allocator((allocator<char> *)&aStack_a39);
  fStack_b18 = 0.5;
  fStack_b1c = 10.0;
  pAStack_a18 = pAVar9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&sStack_b48,"learn multiplier",&aStack_b49);
  std::__cxx11::to_string(&sStack_bb0,fStack_b18);
  std::operator+(&bStack_b90,
                 "initial learn limit, is a multiple of the clauses in  the formula (default ",
                 &sStack_bb0);
  std::operator+(&bStack_b70,&bStack_b90,"x)");
  uStack_c23 = 1;
  pbStack_c20 = &bStack_c18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&bStack_c18,"l",&aStack_c21);
  pbStack_c20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)asStack_bf8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_bf8,"learn-mult",&aStack_c22);
  uStack_c23 = 0;
  pbStack_bd8 = &bStack_c18;
  sStack_bd0 = 2;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&aStack_c24);
  __l_00._M_len = sStack_bd0;
  __l_00._M_array = pbStack_bd8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&vStack_bc8,__l_00,&aStack_c24);
  pAVar8 = Utils::ArgumentParser::make_option<float>
                     (&AStack_1c8,&sStack_b48,&bStack_b70,&vStack_bc8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_bc8);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&aStack_c24);
  pbStack_1490 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pbStack_bd8;
  do {
    pbStack_1490 = pbStack_1490 + -1;
    std::__cxx11::string::~string((string *)pbStack_1490);
  } while (pbStack_1490 != &bStack_c18);
  std::allocator<char>::~allocator((allocator<char> *)&aStack_c22);
  std::allocator<char>::~allocator((allocator<char> *)&aStack_c21);
  std::__cxx11::string::~string((string *)&bStack_b70);
  std::__cxx11::string::~string((string *)&bStack_b90);
  std::__cxx11::string::~string((string *)&sStack_bb0);
  std::__cxx11::string::~string((string *)&sStack_b48);
  std::allocator<char>::~allocator((allocator<char> *)&aStack_b49);
  pAStack_b28 = pAVar8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&sStack_c50,"learn increase",&aStack_c51);
  std::__cxx11::to_string(&sStack_cb8,fStack_b1c);
  std::operator+(&bStack_c98,
                 "when the learn limit is reached, some learned clauses are eliminated and the learn limit is increased by this percentage (default "
                 ,&sStack_cb8);
  std::operator+(&bStack_c78,&bStack_c98,"%)");
  uStack_d2b = 1;
  pbStack_d28 = &bStack_d20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&bStack_d20,"i",&aStack_d29);
  pbStack_d28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)asStack_d00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_d00,"learn-increase",&aStack_d2a);
  uStack_d2b = 0;
  pbStack_ce0 = &bStack_d20;
  sStack_cd8 = 2;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&aStack_d2c);
  __l._M_len = sStack_cd8;
  __l._M_array = pbStack_ce0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&vStack_cd0,__l,&aStack_d2c);
  pAVar8 = Utils::ArgumentParser::make_option<float>
                     (&AStack_1c8,&sStack_c50,&bStack_c78,&vStack_cd0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_cd0);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&aStack_d2c);
  pbStack_14e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pbStack_ce0;
  do {
    pbStack_14e0 = pbStack_14e0 + -1;
    std::__cxx11::string::~string((string *)pbStack_14e0);
  } while (pbStack_14e0 != &bStack_d20);
  std::allocator<char>::~allocator((allocator<char> *)&aStack_d2a);
  std::allocator<char>::~allocator((allocator<char> *)&aStack_d29);
  std::__cxx11::string::~string((string *)&bStack_c78);
  std::__cxx11::string::~string((string *)&bStack_c98);
  std::__cxx11::string::~string((string *)&sStack_cb8);
  std::__cxx11::string::~string((string *)&sStack_c50);
  std::allocator<char>::~allocator((allocator<char> *)&aStack_c51);
  pAStack_c30 = pAVar8;
  Utils::ArgumentParser::parseCLI(&AStack_1c8,iStack_58,ppcStack_60);
  bVar3 = Utils::ArgObject::operator_cast_to_bool(&pAStack_260->super_ArgObject);
  if (bVar3) {
    Utils::operator<<((ostream *)&std::cout,&AStack_1c8);
    uStack_54 = 0;
    uStack_d3c = 1;
  }
  else {
    std::ifstream::ifstream(auStack_f48);
    std::istream::istream(alStack_1060,(streambuf *)0x0);
    bVar3 = Utils::ArgObject::operator_cast_to_bool((ArgObject *)pAStack_208);
    if (bVar3) {
      pbVar10 = Utils::
                TypedArgObj<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::get_value(&pAStack_208->
                             super_TypedArgObj<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           );
      std::ifstream::open(auStack_f48,pbVar10,8);
      bVar4 = std::ios::good();
      if ((bVar4 & 1) == 0) {
        poVar5 = std::operator<<((ostream *)&std::cout,"ERROR: file ");
        pbVar10 = Utils::
                  TypedArgObj<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::get_value(&pAStack_208->
                               super_TypedArgObj<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             );
        poVar5 = std::operator<<(poVar5,(string *)pbVar10);
        std::operator<<(poVar5," doesn\'t exist\n");
        exit(0);
      }
      lVar1 = *(long *)(alStack_1060[0] + -0x18);
      std::ifstream::rdbuf();
      std::ios::rdbuf((streambuf *)((long)alStack_1060 + lVar1));
    }
    else {
      lVar1 = *(long *)(alStack_1060[0] + -0x18);
      std::ios::rdbuf();
      std::ios::rdbuf((streambuf *)((long)alStack_1060 + lVar1));
    }
    bVar3 = Utils::ArgObject::operator_cast_to_bool((ArgObject *)pAStack_848);
    fVar2 = fStack_83c;
    if (bVar3) {
      pfVar12 = Utils::TypedArgObj<float>::get_value(&pAStack_848->super_TypedArgObj<float>);
      fStack_1064 = *pfVar12;
      if ((fStack_1064 <= 0.0) || (fVar2 = fStack_1064, 1.0 < fStack_1064)) {
        poVar5 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_c3ea);
        Utils::operator<<(poVar5,&AStack_1c8);
        exit(1);
      }
    }
    fStack_83c = fVar2;
    bVar3 = Utils::ArgObject::operator_cast_to_bool((ArgObject *)pAStack_930);
    fVar2 = fStack_838;
    if (bVar3) {
      pfVar12 = Utils::TypedArgObj<float>::get_value(&pAStack_930->super_TypedArgObj<float>);
      fStack_1068 = *pfVar12;
      if ((fStack_1068 <= 0.0) || (fVar2 = fStack_1068, 1.0 < fStack_1068)) {
        poVar5 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_c403);
        Utils::operator<<(poVar5,&AStack_1c8);
        exit(1);
      }
    }
    fStack_838 = fVar2;
    bVar3 = Utils::ArgObject::operator_cast_to_bool((ArgObject *)pAStack_a18);
    if (bVar3) {
      puVar11 = Utils::TypedArgObj<unsigned_int>::get_value
                          (&pAStack_a18->super_TypedArgObj<unsigned_int>);
      if ((double)*puVar11 < 1.0) {
        poVar5 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_c40e);
        Utils::operator<<(poVar5,&AStack_1c8);
        exit(1);
      }
      puVar11 = Utils::TypedArgObj<unsigned_int>::get_value
                          (&pAStack_a18->super_TypedArgObj<unsigned_int>);
      uStack_a10 = *puVar11;
    }
    bVar3 = Utils::ArgObject::operator_cast_to_bool((ArgObject *)pAStack_b28);
    if (bVar3) {
      pfVar12 = Utils::TypedArgObj<float>::get_value(&pAStack_b28->super_TypedArgObj<float>);
      if (*pfVar12 <= 0.0) {
        poVar5 = std::operator<<((ostream *)&std::cout,"ERROR: should be learn-mult > 0.0\n");
        Utils::operator<<(poVar5,&AStack_1c8);
        exit(1);
      }
      pfVar12 = Utils::TypedArgObj<float>::get_value(&pAStack_b28->super_TypedArgObj<float>);
      fStack_b18 = *pfVar12;
    }
    bVar3 = Utils::ArgObject::operator_cast_to_bool((ArgObject *)pAStack_c30);
    if (bVar3) {
      pfVar12 = Utils::TypedArgObj<float>::get_value(&pAStack_c30->super_TypedArgObj<float>);
      if (*pfVar12 < 0.0) {
        poVar5 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_c432);
        Utils::operator<<(poVar5,&AStack_1c8);
        exit(1);
      }
      pfVar12 = Utils::TypedArgObj<float>::get_value(&pAStack_c30->super_TypedArgObj<float>);
      fStack_b1c = *pfVar12;
    }
    bVar3 = Utils::ArgObject::operator_cast_to_bool(&pAStack_330->super_ArgObject);
    Satyricon::SATSolver::set_log(&solver,bVar3 + 1);
    start.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    rStack_1070 = (rep)start.__d.__r;
    bStack_1071 = Satyricon::parse_file(&solver,(istream *)alStack_1060);
    tStack_1080.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    dStack_1090.__r = (rep)std::chrono::operator-(&tStack_1080,&start);
    std::chrono::duration<float,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
              ((duration<float,std::ratio<1l,1l>> *)&dStack_1084,&dStack_1090);
    poVar5 = std::operator<<((ostream *)&std::cout,"read file and initialized solver in: ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::fixed);
    iStack_1094 = (int)std::setprecision(2);
    poVar5 = std::operator<<(poVar5,(_Setprecision)iStack_1094);
    rVar15 = std::chrono::duration<float,_std::ratio<1L,_1L>_>::count(&dStack_1084);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,rVar15);
    std::operator<<(poVar5,"s\n");
    if ((bStack_1071 & 1) == 0) {
      bVar3 = Utils::ArgObject::operator_cast_to_bool(&pAStack_4d0->super_ArgObject);
      if (bVar3) {
        Satyricon::SATSolver::set_preprocessing(&solver,false);
      }
      bVar3 = Utils::ArgObject::operator_cast_to_bool(&pAStack_580->super_ArgObject);
      if (bVar3) {
        Satyricon::SATSolver::set_restart(&solver,false);
      }
      bVar3 = Utils::ArgObject::operator_cast_to_bool(&pAStack_630->super_ArgObject);
      if (bVar3) {
        Satyricon::SATSolver::set_deletion(&solver,false);
      }
      bVar3 = Utils::ArgObject::operator_cast_to_bool(&pAStack_6e0->super_ArgObject);
      if (bVar3) {
        Satyricon::SATSolver::set_random_choice(&solver,false);
      }
      bVar3 = Utils::ArgObject::operator_cast_to_bool(&pAStack_790->super_ArgObject);
      if (bVar3) {
        Satyricon::SATSolver::set_conflict_clause_reduction(&solver,false);
      }
      Satyricon::SATSolver::set_clause_decay(&solver,(double)fStack_83c);
      Satyricon::SATSolver::set_literal_decay(&solver,(double)fStack_838);
      Satyricon::SATSolver::set_learning_multiplier(&solver,(double)fStack_b18);
      Satyricon::SATSolver::set_learning_increase(&solver,(double)fStack_b1c);
      Satyricon::SATSolver::set_restarting_multiplier(&solver,uStack_a10);
      bStack_10a1 = Satyricon::SATSolver::solve(&solver);
      tStack_10b0.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      dStack_10c0.__r = (rep)std::chrono::operator-(&tStack_10b0,&start);
      std::chrono::duration<double,std::ratio<1l,1l>>::
      duration<long,std::ratio<1l,1000000000l>,void>
                ((duration<double,std::ratio<1l,1l>> *)&dStack_10b8,&dStack_10c0);
      poVar5 = std::operator<<((ostream *)&std::cout,"completed in: ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::fixed);
      iStack_10c4 = (int)std::setprecision(2);
      poVar5 = std::operator<<(poVar5,(_Setprecision)iStack_10c4);
      rVar16 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&dStack_10b8);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,rVar16);
      std::operator<<(poVar5,"s\n");
      pcVar13 = "UNSATISFIABLE";
      if ((bStack_10a1 & 1) != 0) {
        pcVar13 = "SATISFIABLE";
      }
      poVar5 = std::operator<<((ostream *)&std::cout,pcVar13);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      bVar3 = Utils::ArgObject::operator_cast_to_bool(&pAStack_400->super_ArgObject);
      if ((bVar3) && ((bStack_10a1 & 1) != 0)) {
        poVar5 = std::operator<<((ostream *)&std::cout,"Model: ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        Satyricon::SATSolver::string_model_abi_cxx11_(&sStack_10e8,&solver);
        poVar5 = std::operator<<(poVar5,(string *)&sStack_10e8);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)&sStack_10e8);
      }
    }
    else {
      std::operator<<((ostream *)&std::cout,"found a conflict during solver construction\n");
      poVar5 = std::operator<<((ostream *)&std::cout,"UNSATISFIABLE");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
    uStack_54 = 0;
    uStack_d3c = 1;
    std::istream::~istream(alStack_1060);
    std::ifstream::~ifstream(auStack_f48);
  }
  Utils::ArgumentParser::~ArgumentParser(&AStack_1c8);
  return;
}

Assistant:

void signalHandler( int signum ) {
    //TODO: print solver status
    cout << "Interrupt signal (" << signum << ") received.\n";

    auto end_time = std::chrono::steady_clock::now();
    std::chrono::duration<double> elapsed = end_time - start;
    cout << "stopped after: " << std::fixed << std::setprecision(2) <<
        elapsed.count() << "s\n";

    cout << "UNKNOWN\n";
    std::_Exit(1); // quick exit
}